

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *local_40;
  WirePointer *ref;
  word *defaultValue_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    local_40 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_40 = this->pointer;
  }
  WireHelpers::readListPointer
            (__return_storage_ptr__,this->segment,this->capTable,local_40,defaultValue,VOID,
             this->nestingLimit,false);
  return __return_storage_ptr__;
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}